

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O2

int If_CutSopBalanceEval(If_Man_t *p,If_Cut_t *pCut,Vec_Int_t *vAig)

{
  byte bVar1;
  Vec_Wec_t *p_00;
  uint uVar2;
  int iVar3;
  If_Obj_t *pIVar4;
  Vec_Int_t *vCover;
  ulong uVar5;
  int Area;
  int pTimes [15];
  
  uVar2 = *(uint *)&pCut->field_0x1c | 0x2000;
  *(uint *)&pCut->field_0x1c = uVar2;
  if (vAig != (Vec_Int_t *)0x0) {
    vAig->nSize = 0;
    uVar2 = *(uint *)&pCut->field_0x1c;
  }
  if (uVar2 < 0x1000000) {
    iVar3 = If_CutTruthLit(pCut);
    iVar3 = Abc_Lit2Var(iVar3);
    if (iVar3 != 0) {
      __assert_fail("Abc_Lit2Var(If_CutTruthLit(pCut)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                    ,0xff,"int If_CutSopBalanceEval(If_Man_t *, If_Cut_t *, Vec_Int_t *)");
    }
    if (vAig != (Vec_Int_t *)0x0) {
      iVar3 = If_CutTruthLit(pCut);
      iVar3 = Abc_LitIsCompl(iVar3);
      Vec_IntPush(vAig,iVar3);
    }
    *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xfffff000;
    iVar3 = 0;
  }
  else if (uVar2 >> 0x18 == 1) {
    iVar3 = If_CutTruthLit(pCut);
    iVar3 = Abc_Lit2Var(iVar3);
    if (iVar3 != 1) {
      __assert_fail("Abc_Lit2Var(If_CutTruthLit(pCut)) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                    ,0x107,"int If_CutSopBalanceEval(If_Man_t *, If_Cut_t *, Vec_Int_t *)");
    }
    if (vAig != (Vec_Int_t *)0x0) {
      Vec_IntPush(vAig,0);
      iVar3 = If_CutTruthLit(pCut);
      iVar3 = Abc_LitIsCompl(iVar3);
      Vec_IntPush(vAig,iVar3);
    }
    *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xfffff000;
    pIVar4 = If_CutLeaf(p,pCut,0);
    iVar3 = (int)(pIVar4->CutBest).Delay;
  }
  else {
    p_00 = p->vTtIsops[uVar2 >> 0x18];
    iVar3 = If_CutTruthLit(pCut);
    iVar3 = Abc_Lit2Var(iVar3);
    vCover = Vec_WecEntry(p_00,iVar3);
    Area = 0;
    if (vCover == (Vec_Int_t *)0x0) {
      iVar3 = -1;
    }
    else {
      if (vCover->nSize < 1) {
        __assert_fail("Vec_IntSize(vCover) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                      ,0x117,"int If_CutSopBalanceEval(If_Man_t *, If_Cut_t *, Vec_Int_t *)");
      }
      for (uVar5 = 0; bVar1 = pCut->field_0x1f, uVar5 < bVar1; uVar5 = uVar5 + 1) {
        pIVar4 = If_CutLeaf(p,pCut,(int)uVar5);
        pTimes[uVar5] = (int)(pIVar4->CutBest).Delay;
      }
      iVar3 = If_CutTruthLit(pCut);
      uVar2 = Abc_LitIsCompl(iVar3);
      iVar3 = If_CutSopBalanceEvalIntInt
                        (vCover,(uint)bVar1,pTimes,vAig,
                         *(uint *)&pCut->field_0x1c >> 0xc & 1 ^ uVar2,&Area);
      *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xfffff000 | Area & 0xfffU;
    }
  }
  return iVar3;
}

Assistant:

int If_CutSopBalanceEval( If_Man_t * p, If_Cut_t * pCut, Vec_Int_t * vAig )
{
    pCut->fUser = 1;
    if ( vAig )
        Vec_IntClear( vAig );
    if ( pCut->nLeaves == 0 ) // const
    {
        assert( Abc_Lit2Var(If_CutTruthLit(pCut)) == 0 );
        if ( vAig )
            Vec_IntPush( vAig, Abc_LitIsCompl(If_CutTruthLit(pCut)) );
        pCut->Cost = 0;
        return 0;
    }
    if ( pCut->nLeaves == 1 ) // variable
    {
        assert( Abc_Lit2Var(If_CutTruthLit(pCut)) == 1 );
        if ( vAig )
            Vec_IntPush( vAig, 0 );
        if ( vAig )
            Vec_IntPush( vAig, Abc_LitIsCompl(If_CutTruthLit(pCut)) );
        pCut->Cost = 0;
        return (int)If_ObjCutBest(If_CutLeaf(p, pCut, 0))->Delay;
    }
    else
    {
        int fVerbose = 0;
        Vec_Int_t * vCover = Vec_WecEntry( p->vTtIsops[pCut->nLeaves], Abc_Lit2Var(If_CutTruthLit(pCut)) );
        int Delay, Area = 0;
        int i, pTimes[IF_MAX_FUNC_LUTSIZE];
        if ( vCover == NULL )
            return -1;
        assert( Vec_IntSize(vCover) > 0 );
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
            pTimes[i] = (int)If_ObjCutBest(If_CutLeaf(p, pCut, i))->Delay; 
        Delay = If_CutSopBalanceEvalIntInt( vCover, If_CutLeaveNum(pCut), pTimes, vAig, Abc_LitIsCompl(If_CutTruthLit(pCut)) ^ pCut->fCompl, &Area );
        pCut->Cost = Area;
        if ( fVerbose )
        {
            int Max = 0, Two = 0;
            for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
                Max = Abc_MaxInt( Max, pTimes[i] );
            for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
                if ( pTimes[i] != Max )
                    Two = Abc_MaxInt( Two, pTimes[i] );
            if ( Two + 2 < Max && Max + 3 < Delay )
            {
                for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
                    printf( "%3d ", pTimes[i] );
                for ( ; i < p->pPars->nLutSize; i++ )
                    printf( "    " );
                printf( "-> %3d   ", Delay );
                Dau_DsdPrintFromTruth( If_CutTruthW(p, pCut), If_CutLeaveNum(pCut) );
                Kit_TruthIsopPrintCover( vCover, If_CutLeaveNum(pCut), Abc_LitIsCompl(If_CutTruthLit(pCut)) ^ pCut->fCompl );
                {
                    Vec_Int_t vIsop;
                    int pIsop[64];
                    vIsop.nCap = vIsop.nSize = Abc_Tt6Esop( *If_CutTruthW(p, pCut), pCut->nLeaves, pIsop );
                    vIsop.pArray = pIsop;
                    printf( "ESOP (%d -> %d)\n", Vec_IntSize(vCover), vIsop.nSize );
                    Kit_TruthIsopPrintCover( &vIsop, If_CutLeaveNum(pCut), 0 );
                }
                printf( "\n" );
            }
        }
        return Delay;
    }
}